

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-stroke-builder.cpp
# Opt level: O0

Direction __thiscall
gepard::StrokePathBuilder::LineAttributes::vectorCompare(LineAttributes *this,LineAttributes *line)

{
  Float FVar1;
  double dVar2;
  Float direction;
  LineAttributes *line_local;
  LineAttributes *this_local;
  
  FVar1 = FloatPoint::cross(&this->unit,&line->unit);
  if (FVar1 <= 0.0) {
    if (0.0 <= FVar1) {
      dVar2 = (this->unit).y + (line->unit).y;
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        this_local._4_4_ = Same;
      }
      else {
        this_local._4_4_ = Reverse;
      }
    }
    else {
      this_local._4_4_ = Negative;
    }
  }
  else {
    this_local._4_4_ = Positive;
  }
  return this_local._4_4_;
}

Assistant:

StrokePathBuilder::LineAttributes::Direction StrokePathBuilder::LineAttributes::vectorCompare(const LineAttributes* line) const
{
    const Float direction = unit.cross(line->unit);

    if (direction > 0.0)
        return Direction::Positive;
    if (direction < 0.0)
        return Direction::Negative;

    if (!(unit.y + line->unit.y))
        return Direction::Reverse;

    return Direction::Same;
}